

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O0

Merge __thiscall Sector::merge(Sector *this,Sector *sector)

{
  int iVar1;
  bool bVar2;
  Merge MVar3;
  reference new_data;
  Merge add_ret;
  Data *data;
  iterator __end1;
  iterator __begin1;
  vector<Data,_std::allocator<Data>_> *__range1;
  Merge ret;
  Sector *sector_local;
  Sector *this_local;
  
  bVar2 = has_badidcrc(sector);
  if (bVar2) {
    this_local._4_4_ = Unchanged;
  }
  else {
    bVar2 = Header::operator==(&sector->header,&this->header);
    if (!bVar2) {
      __assert_fail("sector.header == header",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Sector.cpp"
                    ,0xda,"Sector::Merge Sector::merge(Sector &&)");
    }
    if (sector->datarate != this->datarate) {
      __assert_fail("sector.datarate == datarate",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Sector.cpp"
                    ,0xdb,"Sector::Merge Sector::merge(Sector &&)");
    }
    if (sector->encoding != this->encoding) {
      __assert_fail("sector.encoding == encoding",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Sector.cpp"
                    ,0xdc,"Sector::Merge Sector::merge(Sector &&)");
    }
    bVar2 = has_badidcrc(this);
    if (bVar2) {
      iVar1 = (sector->header).head;
      (this->header).cyl = (sector->header).cyl;
      (this->header).head = iVar1;
      iVar1 = (sector->header).size;
      (this->header).sector = (sector->header).sector;
      (this->header).size = iVar1;
      set_badidcrc(this,false);
    }
    __range1._4_4_ = (Merge)bVar2;
    bVar2 = has_baddatacrc(this);
    if ((bVar2) || (bVar2 = has_baddatacrc(sector), !bVar2)) {
      __end1 = std::vector<Data,_std::allocator<Data>_>::begin(&sector->m_data);
      data = (Data *)std::vector<Data,_std::allocator<Data>_>::end(&sector->m_data);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>
                                         *)&data), bVar2) {
        new_data = __gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
                   operator*(&__end1);
        bVar2 = has_baddatacrc(sector);
        MVar3 = add(this,new_data,bVar2,sector->dam);
        if ((MVar3 == Improved) || (__range1._4_4_ == Unchanged)) {
          __range1._4_4_ = MVar3;
        }
        __gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::operator++
                  (&__end1);
      }
      std::vector<Data,_std::allocator<Data>_>::clear(&sector->m_data);
      this_local._4_4_ = __range1._4_4_;
    }
    else {
      this_local._4_4_ = __range1._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

Sector::Merge Sector::merge(Sector&& sector)
{
    Merge ret = Merge::Unchanged;

    // If the new header CRC is bad there's nothing we can use
    if (sector.has_badidcrc())
        return Merge::Unchanged;

    // Something is wrong if the new details don't match the existing one
    assert(sector.header == header);
    assert(sector.datarate == datarate);
    assert(sector.encoding == encoding);

    // If the existing header is bad, repair it
    if (has_badidcrc())
    {
        header = sector.header;
        set_badidcrc(false);
        ret = Merge::Improved;
    }

    // We can't repair good data with bad
    if (!has_baddatacrc() && sector.has_baddatacrc())
        return ret;

    // Add the new data snapshots
    for (Data& data : sector.m_data)
    {
        // Move the data into place, passing on the existing data CRC status and DAM
        auto add_ret = add(std::move(data), sector.has_baddatacrc(), sector.dam);
        if (add_ret == Merge::Improved || (ret == Merge::Unchanged))
            ret = add_ret;
    }
    sector.m_data.clear();

    return ret;
}